

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

void test_many<short>(void)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  short sVar9;
  short d;
  random_numerators<short> data;
  TestResult local_1b0;
  char type_buffer [64];
  char local_138 [264];
  
  snprintf(type_buffer,0x40,"=== libdivide %s benchmark ===","s16");
  snprintf(local_138,0x80,"\n%50s\n\n",type_buffer);
  std::operator<<((ostream *)&std::cout,local_138);
  print_report_header();
  random_numerators<short>::random_numerators(&data);
  d = 1;
  do {
    do {
      test_one<short>(&local_1b0,d,&data);
      iVar8 = local_1b0.algo;
      dVar7 = local_1b0.gen_time;
      dVar6 = local_1b0.vector_branchfree_time;
      dVar5 = local_1b0.vector_time;
      dVar4 = local_1b0.branchfree_time;
      dVar3 = local_1b0.base_time;
      dVar2 = local_1b0.hardware_time;
      snprintf(type_buffer,0x20,"%d",(ulong)(uint)(int)d);
      snprintf(local_138,0x100,"%6s %10.3f %10.3f %10.3f %10.3f %10.3f %10.3f %4d\n",dVar2,dVar3,
               dVar4,dVar5,dVar6,dVar7,type_buffer,(ulong)(uint)iVar8);
      std::operator<<((ostream *)&std::cout,local_138);
      sVar9 = 1 - d;
      bVar1 = -1 < d;
      d = -d;
    } while (bVar1);
    d = sVar9;
  } while( true );
}

Assistant:

static void print_banner() {
    char type_buffer[64];
    snprintf(type_buffer, sizeof type_buffer,
        "=== libdivide %s benchmark ===", type_tag<_IntT>::get_tag());
    char buffer[128];
    snprintf(buffer, sizeof buffer, "\n%50s\n\n", type_buffer);
    PRINT_INFO(buffer);
}